

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Aig_Man_t * Saig_ManRetimeDupInitState(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Man_t *p_01;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vCut_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1);
  Aig_ManCleanData(p);
  pAVar2 = Aig_ManConst1(p_01);
  pAVar3 = Aig_ManConst1(p);
  (pAVar3->field_5).pData = pAVar2;
  for (local_2c = 0; iVar1 = Vec_PtrSize(vCut), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar4 = Vec_PtrEntry(vCut,local_2c);
    pAVar2 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar2;
  }
  for (local_2c = 0; iVar1 = Saig_ManRegNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_2c + iVar1);
    pAVar3 = Aig_ObjFanin0(pAVar2);
    Saig_ManRetimeDup_rec(p_01,pAVar3);
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    Aig_ObjCreateCo(p_01,pAVar2);
  }
  return p_01;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupInitState( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // duplicate logic above the cut and create POs
    Saig_ManForEachLi( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    return pNew;
}